

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>::
disposeImpl(HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket> *this,
           void *pointer)

{
  PromiseArenaMember *node;
  long *plVar1;
  
  if (pointer != (void *)0x0) {
    if ((*(char *)((long)pointer + 0x18) == '\x01') &&
       (node = *(PromiseArenaMember **)((long)pointer + 0x20), node != (PromiseArenaMember *)0x0)) {
      *(undefined8 *)((long)pointer + 0x20) = 0;
      PromiseDisposer::dispose(node);
    }
    plVar1 = *(long **)((long)pointer + 0x10);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    operator_delete(pointer,0x30);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }